

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O0

void Shell::Shuffling::shuffleTwoList<unsigned_int,Kernel::TermList>
               (List<unsigned_int> **list1,List<Kernel::TermList> **list2)

{
  uint uVar1;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *this;
  TermList elem;
  undefined8 *in_RSI;
  ulong n;
  undefined8 *in_RDI;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> pVar2;
  List<Kernel::TermList> *res2;
  List<unsigned_int> *res1;
  List<Kernel::TermList> *els2;
  List<unsigned_int> *els1;
  uint idx;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> aux;
  uint len;
  List<Kernel::TermList> **in_stack_ffffffffffffff28;
  TermList in_stack_ffffffffffffff30;
  List<unsigned_int> *in_stack_ffffffffffffff38;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>
  *in_stack_ffffffffffffff40;
  uint elem_00;
  undefined4 in_stack_ffffffffffffff48;
  List<Kernel::TermList> *local_78;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *local_70;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> local_58;
  List<Kernel::TermList> *local_48;
  List<unsigned_int> *local_40;
  uint local_34;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> local_30;
  uint local_14;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = Lib::List<unsigned_int>::length
                       ((List<unsigned_int> *)in_stack_ffffffffffffff30._content);
  if (1 < local_14) {
    Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::DArray
              (in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    local_34 = 0;
    local_40 = (List<unsigned_int> *)*local_8;
    local_48 = (List<Kernel::TermList> *)*local_10;
    while (local_40 != (List<unsigned_int> *)0x0) {
      pVar2 = std::make_pair<Lib::List<unsigned_int>*&,Lib::List<Kernel::TermList>*&>
                        ((List<unsigned_int> **)in_stack_ffffffffffffff30._content,
                         in_stack_ffffffffffffff28);
      n = (ulong)local_34;
      local_34 = local_34 + 1;
      local_58 = pVar2;
      this = Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::
             operator[](&local_30,n);
      std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>::operator=(this,&local_58)
      ;
      local_40 = Lib::List<unsigned_int>::tail(local_40);
      local_48 = Lib::List<Kernel::TermList>::tail(local_48);
    }
    shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
              (in_stack_ffffffffffffff40,(uint)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    local_70 = (DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *)0x0;
    local_78 = (List<Kernel::TermList> *)0x0;
    for (local_34 = 0; elem_00 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20),
        local_34 < local_14; local_34 = local_34 + 1) {
      elem._content =
           (uint64_t)
           Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::
           operator[](&local_30,(ulong)local_34);
      uVar1 = Lib::List<unsigned_int>::head
                        (((pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
                         elem._content)->first);
      local_70 = (DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *)
                 Lib::List<unsigned_int>::cons(elem_00,in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff40 = local_70;
      in_stack_ffffffffffffff38 =
           (List<unsigned_int> *)
           Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::
           operator[](&local_30,(ulong)local_34);
      in_stack_ffffffffffffff30 =
           Lib::List<Kernel::TermList>::head
                     ((List<Kernel::TermList> *)in_stack_ffffffffffffff38->_tail);
      local_78 = Lib::List<Kernel::TermList>::cons
                           (elem,(List<Kernel::TermList> *)CONCAT44(uVar1,in_stack_ffffffffffffff48)
                           );
    }
    *local_8 = local_70;
    *local_10 = local_78;
    Lib::DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_>::~DArray
              ((DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> *)
               in_stack_ffffffffffffff30._content);
  }
  return;
}

Assistant:

static void shuffleTwoList(List<T>*& list1, List<S>*& list2) {
    unsigned len = List<T>::length(list1);

    if (len <= 1) {
      return;
    }

    DArray<std::pair<List<T>*,List<S>*>> aux(len);
    unsigned idx = 0;

    List<T>* els1 = list1;
    List<S>* els2 = list2;
    while (els1 != nullptr) {
      ASS_NEQ(els2,0);
      aux[idx++] = std::make_pair(els1,els2);
      els1 = els1->tail();
      els2 = els2->tail();
    }
    ASS_EQ(els2,0);
    shuffleArray(aux,len);

    // create the new lists
    List<T>* res1 = nullptr;
    List<S>* res2 = nullptr;
    for(idx = 0; idx < len; idx++) {
      res1 = List<T>::cons(aux[idx].first->head(),res1);
      res2 = List<S>::cons(aux[idx].second->head(),res2);
    }

    // List<T>::destroy(list1);
    // List<S>::destroy(list2);

    list1 = res1;
    list2 = res2;
  }